

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O0

bool absl::AbslParseFlag(string_view text,LogSeverity *dst,string *err)

{
  string_view piece1;
  string_view piece1_00;
  string_view piece1_01;
  string_view piece1_02;
  string_view piece1_03;
  string_view piece1_04;
  bool bVar1;
  const_reference pvVar2;
  string *in_R8;
  string_view input;
  undefined4 local_114;
  undefined1 auStack_110 [4];
  type_conflict1 numeric_value;
  LogSeverity *local_100;
  char *local_f8;
  string_view local_f0;
  LogSeverity *local_e0;
  char *local_d8;
  string_view local_d0;
  LogSeverity *local_c0;
  char *local_b8;
  string_view local_b0;
  LogSeverity *local_a0;
  char *local_98;
  string_view local_90;
  LogSeverity *local_80;
  char *local_78;
  string_view local_70;
  LogSeverity *local_60;
  char *local_58;
  LogSeverity *local_50;
  char *local_48;
  string_view local_40;
  string *local_30;
  string *err_local;
  LogSeverity *dst_local;
  string_view text_local;
  
  local_48 = text._M_str;
  local_50 = (LogSeverity *)text._M_len;
  local_30 = err;
  err_local = (string *)dst;
  dst_local = local_50;
  text_local._M_len = (size_t)local_48;
  local_40 = StripAsciiWhitespace(text);
  dst_local = (LogSeverity *)local_40._M_len;
  text_local._M_len = (size_t)local_40._M_str;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&dst_local);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)local_30,"no value provided");
    return false;
  }
  local_60 = dst_local;
  local_58 = (char *)text_local._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"dfatal");
  piece1_04._M_str = local_58;
  piece1_04._M_len = (size_t)local_60;
  bVar1 = EqualsIgnoreCase(piece1_04,local_70);
  if (!bVar1) {
    local_80 = dst_local;
    local_78 = (char *)text_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_90,"klogdebugfatal");
    piece1_03._M_str = local_78;
    piece1_03._M_len = (size_t)local_80;
    bVar1 = EqualsIgnoreCase(piece1_03,local_90);
    if (!bVar1) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                         ((basic_string_view<char,_std::char_traits<char>_> *)&dst_local);
      if ((*pvVar2 == 'k') ||
         (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front
                             ((basic_string_view<char,_std::char_traits<char>_> *)&dst_local),
         *pvVar2 == 'K')) {
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                  ((basic_string_view<char,_std::char_traits<char>_> *)&dst_local,1);
      }
      local_a0 = dst_local;
      local_98 = (char *)text_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,"info");
      piece1_02._M_str = local_98;
      piece1_02._M_len = (size_t)local_a0;
      bVar1 = EqualsIgnoreCase(piece1_02,local_b0);
      if (bVar1) {
        *(undefined4 *)err_local = 0;
        text_local._M_str._7_1_ = true;
      }
      else {
        local_c0 = dst_local;
        local_b8 = (char *)text_local._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_d0,"warning");
        piece1_01._M_str = local_b8;
        piece1_01._M_len = (size_t)local_c0;
        bVar1 = EqualsIgnoreCase(piece1_01,local_d0);
        if (bVar1) {
          *(undefined4 *)err_local = 1;
          text_local._M_str._7_1_ = true;
        }
        else {
          local_e0 = dst_local;
          local_d8 = (char *)text_local._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_f0,"error");
          piece1_00._M_str = local_d8;
          piece1_00._M_len = (size_t)local_e0;
          bVar1 = EqualsIgnoreCase(piece1_00,local_f0);
          if (bVar1) {
            *(undefined4 *)err_local = 2;
            text_local._M_str._7_1_ = true;
          }
          else {
            local_100 = dst_local;
            local_f8 = (char *)text_local._M_len;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_110,"fatal");
            piece1._M_str = local_f8;
            piece1._M_len = (size_t)local_100;
            bVar1 = EqualsIgnoreCase(piece1,_auStack_110);
            if (bVar1) {
              *(undefined4 *)err_local = 3;
              text_local._M_str._7_1_ = true;
            }
            else {
              input._M_str = (char *)&local_114;
              input._M_len = text_local._M_len;
              bVar1 = ParseFlag<int>((absl *)dst_local,input,(int *)local_30,in_R8);
              if (bVar1) {
                *(undefined4 *)err_local = local_114;
                text_local._M_str._7_1_ = true;
              }
              else {
                std::__cxx11::string::operator=
                          ((string *)local_30,
                           "only integers, absl::LogSeverity enumerators, and DFATAL are accepted");
                text_local._M_str._7_1_ = false;
              }
            }
          }
        }
      }
      return text_local._M_str._7_1_;
    }
    *(undefined4 *)err_local = 3;
    return true;
  }
  *(undefined4 *)err_local = 3;
  return true;
}

Assistant:

bool AbslParseFlag(absl::string_view text, absl::LogSeverity* dst,
                   std::string* err) {
  text = absl::StripAsciiWhitespace(text);
  if (text.empty()) {
    *err = "no value provided";
    return false;
  }
  if (absl::EqualsIgnoreCase(text, "dfatal")) {
    *dst = absl::kLogDebugFatal;
    return true;
  }
  if (absl::EqualsIgnoreCase(text, "klogdebugfatal")) {
    *dst = absl::kLogDebugFatal;
    return true;
  }
  if (text.front() == 'k' || text.front() == 'K') text.remove_prefix(1);
  if (absl::EqualsIgnoreCase(text, "info")) {
    *dst = absl::LogSeverity::kInfo;
    return true;
  }
  if (absl::EqualsIgnoreCase(text, "warning")) {
    *dst = absl::LogSeverity::kWarning;
    return true;
  }
  if (absl::EqualsIgnoreCase(text, "error")) {
    *dst = absl::LogSeverity::kError;
    return true;
  }
  if (absl::EqualsIgnoreCase(text, "fatal")) {
    *dst = absl::LogSeverity::kFatal;
    return true;
  }
  std::underlying_type<absl::LogSeverity>::type numeric_value;
  if (absl::ParseFlag(text, &numeric_value, err)) {
    *dst = static_cast<absl::LogSeverity>(numeric_value);
    return true;
  }
  *err =
      "only integers, absl::LogSeverity enumerators, and DFATAL are accepted";
  return false;
}